

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFArgParser.cc
# Opt level: O3

void __thiscall QPDFArgParser::selectOptionTable(QPDFArgParser *this,string *name)

{
  element_type *peVar1;
  iterator iVar2;
  logic_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry>_>_>_>_>_>
          ::find(&(((this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->option_tables)._M_t,name);
  peVar1 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (iVar2._M_node != &(peVar1->option_tables)._M_t._M_impl.super__Rb_tree_header._M_header) {
    peVar1->option_table = (option_table_t *)(iVar2._M_node + 2);
    std::__cxx11::string::_M_assign((string *)&peVar1->option_table_name);
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::operator+(&bStack_38,"QPDFArgParser: selecting unregistered option table ",name);
  std::logic_error::logic_error(this_00,(string *)&bStack_38);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void
QPDFArgParser::selectOptionTable(std::string const& name)
{
    auto t = m->option_tables.find(name);
    if (t == m->option_tables.end()) {
        QTC::TC("libtests", "QPDFArgParser select unregistered table");
        throw std::logic_error("QPDFArgParser: selecting unregistered option table " + name);
    }
    m->option_table = &(t->second);
    m->option_table_name = name;
}